

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_vfs_unregister(sqlite3_vfs *pVfs)

{
  bool bVar1;
  sqlite3_mutex *psVar2;
  
  bVar1 = true;
  if (sqlite3Config.bCoreMutex != 0) {
    psVar2 = (*sqlite3Config.mutex.xMutexAlloc)(2);
    if (psVar2 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar2);
      bVar1 = false;
      goto LAB_0011396d;
    }
  }
  psVar2 = (sqlite3_mutex *)0x0;
LAB_0011396d:
  vfsUnlink(pVfs);
  if (!bVar1) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar2);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_vfs_unregister(sqlite3_vfs *pVfs){
#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER);
#endif
  sqlite3_mutex_enter(mutex);
  vfsUnlink(pVfs);
  sqlite3_mutex_leave(mutex);
  return SQLITE_OK;
}